

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O2

void __thiscall xray_re::xr_ogf_v3::load_s_desc(xr_ogf_v3 *this,xr_reader *r)

{
  byte *pbVar1;
  uint32_t *puVar2;
  
  xr_reader::r_sz(r,&this->m_source);
  xr_reader::r_sz(r,&this->m_export_tool);
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  this->m_export_time = *puVar2;
  xr_reader::r_sz(r,&(this->super_xr_ogf).super_xr_object.m_owner_name);
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  (this->super_xr_ogf).super_xr_object.m_creation_time = *puVar2;
  xr_reader::r_sz(r,&(this->super_xr_ogf).super_xr_object.m_modif_name);
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  (this->super_xr_ogf).super_xr_object.m_modified_time = *puVar2;
  pbVar1 = (byte *)((long)&(this->super_xr_ogf).m_loaded + 3);
  *pbVar1 = *pbVar1 | 8;
  return;
}

Assistant:

inline void xr_ogf_v3::load_s_desc(xr_reader& r)
{
	r.r_sz(m_source);
	r.r_sz(m_export_tool);
	m_export_time = r.r_u32();
	r.r_sz(m_owner_name);
	m_creation_time = r.r_u32();
	r.r_sz(m_modif_name);
	m_modified_time = r.r_u32();
	set_chunk_loaded(OGF3_S_DESC);
}